

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O0

int archive_compressor_bzip2_close(archive_write_filter *f)

{
  private_data_conflict4 *data_00;
  int iVar1;
  int local_24;
  int local_1c;
  int r1;
  int ret;
  private_data_conflict4 *data;
  archive_write_filter *f_local;
  
  data_00 = (private_data_conflict4 *)f->data;
  local_1c = drive_compressor(f,data_00,1);
  if (local_1c == 0) {
    local_1c = __archive_write_filter
                         (f->next_filter,data_00->compressed,
                          data_00->compressed_buffer_size - (ulong)(data_00->stream).avail_out);
  }
  iVar1 = BZ2_bzCompressEnd(&data_00->stream);
  if (iVar1 != 0) {
    archive_set_error(f->archive,0x16,"Failed to clean up compressor");
    local_1c = -0x1e;
  }
  local_24 = __archive_write_close_filter(f->next_filter);
  if (local_1c <= local_24) {
    local_24 = local_1c;
  }
  return local_24;
}

Assistant:

static int
archive_compressor_bzip2_close(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret, r1;

	/* Finish compression cycle. */
	ret = drive_compressor(f, data, 1);
	if (ret == ARCHIVE_OK) {
		/* Write the last block */
		ret = __archive_write_filter(f->next_filter,
		    data->compressed,
		    data->compressed_buffer_size - data->stream.avail_out);
	}

	switch (BZ2_bzCompressEnd(&(data->stream))) {
	case BZ_OK:
		break;
	default:
		archive_set_error(f->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Failed to clean up compressor");
		ret = ARCHIVE_FATAL;
	}

	r1 = __archive_write_close_filter(f->next_filter);
	return (r1 < ret ? r1 : ret);
}